

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-slays.c
# Opt level: O3

_Bool same_monsters_slain(wchar_t slay1,wchar_t slay2)

{
  int iVar1;
  
  if (slays[slay1].race_flag == slays[slay2].race_flag) {
    if (slays[slay1].base == (char *)0x0) {
      return slays[slay2].base == (char *)0x0;
    }
    if (slays[slay2].base != (char *)0x0) {
      iVar1 = strcmp(slays[slay1].base,slays[slay2].base);
      return iVar1 == 0;
    }
  }
  return false;
}

Assistant:

bool same_monsters_slain(int slay1, int slay2)
{
	if (slays[slay1].race_flag != slays[slay2].race_flag) return false;
	if (!slays[slay1].base && !slays[slay2].base) return true;
	if (slays[slay1].base && !slays[slay2].base) return false;
	if (!slays[slay1].base && slays[slay2].base) return false;
	if (streq(slays[slay1].base, slays[slay2].base)) return true;
	return false;
}